

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O3

CharCount UnifiedRegex::MatchCharNode::FindUniqueEquivs(Char *equivs,Char *uniqueEquivs)

{
  uint uVar1;
  CharCount equivIndex;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  *uniqueEquivs = *equivs;
  uVar1 = 1;
  lVar2 = 1;
  do {
    if (uVar1 == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (ulong)uVar1;
      uVar4 = 0;
      do {
        if (uniqueEquivs[uVar4] == equivs[lVar2]) goto LAB_00e98457;
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    uniqueEquivs[uVar3] = equivs[lVar2];
    uVar1 = uVar1 + 1;
LAB_00e98457:
    lVar2 = lVar2 + 1;
    if (lVar2 == 4) {
      return uVar1;
    }
  } while( true );
}

Assistant:

CharCount MatchCharNode::FindUniqueEquivs(const Char equivs[CaseInsensitive::EquivClassSize], __out_ecount(4) Char uniqueEquivs[CaseInsensitive::EquivClassSize])
    {
        uniqueEquivs[0] = equivs[0];
        CharCount uniqueCount = 1;
        for (CharCount equivIndex = 1; equivIndex < CaseInsensitive::EquivClassSize; ++equivIndex)
        {
            bool alreadyHave = false;
            for (CharCount uniqueIndex = 0; uniqueIndex < uniqueCount; ++uniqueIndex)
            {
                if (uniqueEquivs[uniqueIndex] == equivs[equivIndex])
                {
                    alreadyHave = true;
                    break;
                }
            }

            if (!alreadyHave)
            {
                uniqueEquivs[uniqueCount] = equivs[equivIndex];
                uniqueCount += 1;
            }
        }

        return uniqueCount;
    }